

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB_utils.cpp
# Opt level: O0

void amrex::FillSignedDistance
               (MultiFab *mf,Level *ls_lev,EBFArrayBoxFactory *eb_factory,int refratio,
               bool fluid_has_positive_sign)

{
  longdouble x;
  Real RVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  Geometry *pGVar5;
  double *pdVar6;
  Long LVar7;
  EBFArrayBoxFactory *in_RDX;
  Level *in_RSI;
  Periodicity *in_RDI;
  FabArray<amrex::EBCellFlagFab> *this;
  byte in_R8B;
  Array4<const_double> *apz;
  Array4<const_double> *apy;
  Array4<const_double> *apx;
  Array4<const_double> *bcent;
  GpuArray<double,_6U> *p_facets;
  DeviceVector<GpuArray<Real,_3_*_2>_> facets;
  int ncutcells;
  int *p_cutcell_offset;
  DeviceVector<int> cutcell_offset;
  int *p_is_cut;
  DeviceVector<int> is_cut;
  int nallcells;
  Box eb_search;
  Array4<const_amrex::EBCellFlag> *flag;
  Array4<double> *fab;
  Box *gbx;
  MFIter mfi;
  Real fluid_sign;
  Real ls_roof;
  Real dx_eb_max;
  GpuArray<double,_3U> dx_eb;
  GpuArray<double,_3U> dx_ls;
  int eb_pad;
  FabArray<amrex::EBCellFlagFab> *flags;
  Array<const_MultiCutFab_*,_3> *areafrac;
  MultiCutFab *bndrycent;
  int i;
  FabArrayBase *in_stack_fffffffffffff7c8;
  MFIter *mfi_00;
  undefined2 in_stack_fffffffffffff7d0;
  undefined2 uVar8;
  undefined6 in_stack_fffffffffffff7d2;
  undefined7 in_stack_fffffffffffff7d8;
  undefined1 in_stack_fffffffffffff7df;
  MFIter *in_stack_fffffffffffff7e0;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff7e8;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff7f0;
  FabArrayBase *in_stack_fffffffffffff7f8;
  PODVector<int,_std::allocator<int>_> *this_00;
  Geometry *in_stack_fffffffffffff800;
  anon_class_336_9_fd18774e *in_stack_fffffffffffff810;
  Box *box;
  Real local_7c8;
  undefined1 local_760 [4];
  int in_stack_fffffffffffff8a4;
  Box *in_stack_fffffffffffff8a8;
  undefined1 auStack_6c0 [64];
  Real local_680;
  Real local_678;
  undefined4 local_660;
  int *local_658;
  GpuArray<double,_6U> *local_650;
  int *local_648;
  undefined1 auStack_640 [40];
  char *in_stack_fffffffffffff9e8;
  int in_stack_fffffffffffff9f4;
  char *in_stack_fffffffffffff9f8;
  char *in_stack_fffffffffffffa00;
  undefined1 auStack_5e8 [64];
  undefined1 auStack_5a8 [8];
  Geometry *in_stack_fffffffffffffa60;
  MultiFab *in_stack_fffffffffffffa68;
  Level *in_stack_fffffffffffffa70;
  undefined1 auStack_568 [64];
  undefined1 local_528 [64];
  undefined1 *local_4e8;
  undefined1 local_4e0 [64];
  undefined1 *local_4a0;
  undefined1 local_498 [64];
  undefined1 *local_458;
  undefined1 local_450 [64];
  undefined1 *local_410;
  GpuArray<double,_6U> *local_408;
  PODVector<amrex::GpuArray<double,_6U>,_std::allocator<amrex::GpuArray<double,_6U>_>_> local_400;
  undefined1 local_3d2;
  int *local_3d0;
  Real local_3c8 [4];
  undefined4 local_3a8;
  undefined4 uStack_3a4;
  undefined4 uStack_3a0;
  undefined4 uStack_39c;
  Real local_398;
  Real RStack_390;
  undefined4 uStack_388;
  undefined4 uStack_384;
  undefined4 uStack_380;
  undefined4 local_37c;
  undefined4 uStack_378;
  undefined4 uStack_374;
  undefined4 uStack_370;
  int *local_368;
  int local_35c;
  int *local_358;
  Geometry local_350;
  GpuArray<float,_3U> *local_270;
  undefined1 local_264 [132];
  Real local_1e0;
  double local_1d8;
  double local_1d0;
  GpuArray<double,_3U> local_1c8;
  GpuArray<double,_3U> local_1b0;
  int local_194;
  FabArray<amrex::EBCellFlagFab> *local_190;
  undefined1 local_188 [24];
  undefined1 *local_170;
  MultiCutFab *local_168;
  byte local_15d;
  EBFArrayBoxFactory *local_158;
  Level *local_150;
  Periodicity *local_148;
  undefined8 local_140;
  undefined4 local_134;
  char *local_130;
  char *local_128;
  double *local_120;
  double *local_118;
  GpuArray<double,_3U> *local_110;
  undefined4 local_104;
  GpuArray<double,_3U> *local_100;
  undefined4 local_f4;
  GpuArray<double,_3U> *local_f0;
  undefined4 local_e4;
  GpuArray<double,_3U> *local_e0;
  undefined4 local_d4;
  GpuArray<double,_3U> *local_d0;
  undefined4 local_c4;
  GpuArray<double,_3U> *local_c0;
  undefined4 local_b4;
  GpuArray<double,_3U> *local_b0;
  double *local_a8;
  double *local_a0;
  GpuArray<double,_3U> *local_98;
  int local_8c;
  anon_class_336_9_fd18774e *local_88;
  double *local_80;
  double *local_78;
  double *local_70;
  GpuArray<double,_3U> *local_68;
  double *local_60;
  double *local_58;
  double *local_50;
  GpuArray<double,_3U> *local_48;
  int local_3c;
  IndexType *local_38;
  undefined4 local_30;
  int local_2c;
  IntVect *local_28;
  int local_1c;
  IndexType *local_18;
  int local_c;
  IndexType *local_8;
  
  local_15d = in_R8B & 1;
  local_158 = in_RDX;
  local_150 = in_RSI;
  local_148 = in_RDI;
  bVar3 = FabArrayBase::is_nodal(in_stack_fffffffffffff7c8);
  if (!bVar3) {
    local_128 = "mf.is_nodal()";
    local_130 = 
    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/EB/AMReX_EB_utils.cpp"
    ;
    local_134 = 0x1d6;
    local_140 = 0;
    Assert_host(in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f4,
                in_stack_fffffffffffff9e8);
  }
  EB2::Level::Geom(local_150);
  EB2::Level::fillLevelSet
            (in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,in_stack_fffffffffffffa60);
  local_168 = EBFArrayBoxFactory::getBndryCent
                        ((EBFArrayBoxFactory *)
                         CONCAT62(in_stack_fffffffffffff7d2,in_stack_fffffffffffff7d0));
  EBFArrayBoxFactory::getAreaFrac
            ((EBFArrayBoxFactory *)CONCAT62(in_stack_fffffffffffff7d2,in_stack_fffffffffffff7d0));
  local_170 = local_188;
  local_190 = EBFArrayBoxFactory::getMultiEBCellFlagFab
                        ((EBFArrayBoxFactory *)
                         CONCAT62(in_stack_fffffffffffff7d2,in_stack_fffffffffffff7d0));
  local_194 = MultiCutFab::nGrow((MultiCutFab *)0x142c0e1);
  pGVar5 = EB2::Level::Geom(local_150);
  CoordSys::CellSizeArray(&local_1b0,&pGVar5->super_CoordSys);
  pGVar5 = EBFArrayBoxFactory::Geom(local_158);
  CoordSys::CellSizeArray(&local_1c8,&pGVar5->super_CoordSys);
  local_b4 = 0;
  local_c4 = 1;
  local_118 = local_1c8.arr + 1;
  local_d4 = 2;
  local_120 = local_1c8.arr + 2;
  local_110 = &local_1c8;
  local_d0 = &local_1c8;
  local_c0 = &local_1c8;
  local_b0 = &local_1c8;
  local_70 = local_118;
  local_68 = &local_1c8;
  local_78 = std::max<double>(local_1c8.arr,local_118);
  local_80 = local_120;
  pdVar6 = std::max<double>(local_78,local_120);
  local_1d0 = *pdVar6;
  local_100 = &local_1c8;
  local_e4 = 0;
  local_f4 = 1;
  local_a0 = local_1c8.arr + 1;
  local_104 = 2;
  local_a8 = local_1c8.arr + 2;
  local_f0 = local_100;
  local_e0 = local_100;
  local_98 = local_100;
  local_50 = local_a0;
  local_48 = local_100;
  local_58 = std::min<double>(local_100->arr,local_a0);
  local_60 = local_a8;
  pdVar6 = std::min<double>(local_58,local_a8);
  box = (Box *)*pdVar6;
  this = local_190;
  iVar4 = FabArrayBase::nGrow(&local_190->super_FabArrayBase,0);
  bVar2 = local_15d;
  local_1d8 = (double)box * (double)(iVar4 + 1);
  local_7c8 = literals::operator____rt((literals *)this,(longdouble)1);
  x = (longdouble)1;
  mfi_00 = SUB108(x,0);
  uVar8 = (undefined2)((unkuint10)x >> 0x40);
  RVar1 = literals::operator____rt((literals *)this,x);
  if ((bVar2 & 1) == 0) {
    local_7c8 = -RVar1;
  }
  local_1e0 = local_7c8;
  MFIter::MFIter((MFIter *)in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,
                 (uchar)((ulong)in_stack_fffffffffffff7f0 >> 0x38));
  while (bVar3 = MFIter::isValid((MFIter *)(local_264 + 0x24)), bVar3) {
    MFIter::fabbox(in_stack_fffffffffffff7e0);
    local_264._28_8_ = local_264;
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               CONCAT17(in_stack_fffffffffffff7df,in_stack_fffffffffffff7d8),
               (MFIter *)CONCAT62(in_stack_fffffffffffff7d2,uVar8));
    local_270 = &local_350.roundoff_hi_f;
    bVar3 = MultiCutFab::ok((MultiCutFab *)CONCAT62(in_stack_fffffffffffff7d2,uVar8),mfi_00);
    if (bVar3) {
      FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                ((FabArray<amrex::EBCellFlagFab> *)
                 CONCAT17(in_stack_fffffffffffff7df,in_stack_fffffffffffff7d8),
                 (MFIter *)CONCAT62(in_stack_fffffffffffff7d2,uVar8));
      local_350.roundoff_hi_d.arr[2] = (double)&local_350.prob_domain;
      MFIter::validbox(in_stack_fffffffffffff7e0);
      in_stack_fffffffffffff810 =
           (anon_class_336_9_fd18774e *)
           Box::coarsen(in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a4);
      for (local_8c = 0; local_8c < 3; local_8c = local_8c + 1) {
        local_38 = &(in_stack_fffffffffffff810->eb_search).btype;
        local_3c = local_8c;
        local_1c = local_8c;
        local_c = local_8c;
        if ((local_38->itype & 1 << ((byte)local_8c & 0x1f)) != 0) {
          local_28 = &(in_stack_fffffffffffff810->eb_search).bigend;
          local_2c = local_8c;
          local_30 = 0xffffffff;
          local_28->vect[local_8c] = local_28->vect[local_8c] + -1;
        }
        local_18 = local_38;
      }
      local_8 = &(in_stack_fffffffffffff810->eb_search).btype;
      local_8->itype = 0;
      local_88 = in_stack_fffffffffffff810;
      Box::grow((Box *)in_stack_fffffffffffff810,local_194);
      LVar7 = Box::numPts((Box *)in_stack_fffffffffffff7e0);
      local_350.super_CoordSys.inv_dx[0]._0_4_ = (undefined4)LVar7;
      this_00 = (PODVector<int,_std::allocator<int>_> *)local_350.super_CoordSys.dx;
      PODVector<int,_std::allocator<int>_>::PODVector
                ((PODVector<int,_std::allocator<int>_> *)CONCAT62(in_stack_fffffffffffff7d2,uVar8),
                 (size_type)mfi_00);
      local_350.super_CoordSys.offset[2] = (Real)PODVector<int,_std::allocator<int>_>::data(this_00)
      ;
      in_stack_fffffffffffff800 = &local_350;
      PODVector<int,_std::allocator<int>_>::PODVector
                ((PODVector<int,_std::allocator<int>_> *)CONCAT62(in_stack_fffffffffffff7d2,uVar8),
                 (size_type)mfi_00);
      local_3d0 = PODVector<int,_std::allocator<int>_>::data
                            ((PODVector<int,_std::allocator<int>_> *)in_stack_fffffffffffff800);
      local_3c8[0] = (Real)local_350.super_CoordSys.inv_dx._4_8_;
      local_3a8 = *(undefined4 *)(Real *)local_350.roundoff_hi_d.arr[2];
      uStack_3a4 = *(undefined4 *)((long)(Real *)local_350.roundoff_hi_d.arr[2] + 4);
      uStack_3a0 = *(undefined4 *)((Real *)local_350.roundoff_hi_d.arr[2] + 1);
      uStack_39c = *(undefined4 *)((long)(Real *)local_350.roundoff_hi_d.arr[2] + 0xc);
      local_398 = ((Real *)local_350.roundoff_hi_d.arr[2])[2];
      RStack_390 = *(Real *)((long)local_350.roundoff_hi_d.arr[2] + 0x18);
      uStack_388 = *(undefined4 *)((Real *)((long)local_350.roundoff_hi_d.arr[2] + 0x18) + 1);
      uStack_384 = *(undefined4 *)((long)((long)local_350.roundoff_hi_d.arr[2] + 0x18) + 0xc);
      uStack_380 = *(undefined4 *)((Real *)((long)local_350.roundoff_hi_d.arr[2] + 0x18) + 2);
      local_37c = *(undefined4 *)((long)((long)local_350.roundoff_hi_d.arr[2] + 0x18) + 0x14);
      uStack_378 = *(undefined4 *)
                    ((GpuArray<double,_3U> *)((long)local_350.roundoff_hi_d.arr[2] + 0x30))->arr;
      uStack_374 = *(undefined4 *)
                    ((long)((GpuArray<double,_3U> *)((long)local_350.roundoff_hi_d.arr[2] + 0x30))->
                           arr + 4);
      uStack_370 = *(undefined4 *)
                    (((GpuArray<double,_3U> *)((long)local_350.roundoff_hi_d.arr[2] + 0x30))->arr +
                    1);
      local_368 = (int *)local_350.super_CoordSys.offset[2];
      local_3d2 = 1;
      local_358 = local_3d0;
      local_35c = Scan::
                  PrefixSum<int,int,amrex::FillSignedDistance(amrex::MultiFab&,amrex::EB2::Level_const&,amrex::EBFArrayBoxFactory_const&,int,bool)::__0,amrex::FillSignedDistance(amrex::MultiFab&,amrex::EB2::Level_const&,amrex::EBFArrayBoxFactory_const&,int,bool)::__1,amrex::Scan::Type::Exclusive,void>
                            (local_350.super_CoordSys.inv_dx[0]._0_4_,local_3c8,&local_3d0,1);
      if (0 < local_35c) {
        PODVector<amrex::GpuArray<double,_6U>,_std::allocator<amrex::GpuArray<double,_6U>_>_>::
        PODVector((PODVector<amrex::GpuArray<double,_6U>,_std::allocator<amrex::GpuArray<double,_6U>_>_>
                   *)CONCAT62(in_stack_fffffffffffff7d2,uVar8),(size_type)mfi_00);
        local_408 = PODVector<amrex::GpuArray<double,_6U>,_std::allocator<amrex::GpuArray<double,_6U>_>_>
                    ::data(&local_400);
        MultiCutFab::const_array((MultiCutFab *)CONCAT62(in_stack_fffffffffffff7d2,uVar8),mfi_00);
        local_410 = local_450;
        std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                  ((array<const_amrex::MultiCutFab_*,_3UL> *)
                   CONCAT62(in_stack_fffffffffffff7d2,uVar8),(size_type)mfi_00);
        MultiCutFab::const_array((MultiCutFab *)CONCAT62(in_stack_fffffffffffff7d2,uVar8),mfi_00);
        local_458 = local_498;
        std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                  ((array<const_amrex::MultiCutFab_*,_3UL> *)
                   CONCAT62(in_stack_fffffffffffff7d2,uVar8),(size_type)mfi_00);
        MultiCutFab::const_array((MultiCutFab *)CONCAT62(in_stack_fffffffffffff7d2,uVar8),mfi_00);
        local_4a0 = local_4e0;
        std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                  ((array<const_amrex::MultiCutFab_*,_3UL> *)
                   CONCAT62(in_stack_fffffffffffff7d2,uVar8),(size_type)mfi_00);
        MultiCutFab::const_array((MultiCutFab *)CONCAT62(in_stack_fffffffffffff7d2,uVar8),mfi_00);
        local_4e8 = local_528;
        local_678 = (Real)local_350.super_CoordSys.inv_dx._4_8_;
        local_660 = local_350.super_CoordSys._84_4_;
        local_658 = (int *)local_350.super_CoordSys.offset[2];
        local_650 = local_408;
        local_648 = local_358;
        memcpy(auStack_640,local_410,0x3c);
        memcpy(auStack_5e8,local_458,0x3c);
        memcpy(auStack_5a8,local_4a0,0x3c);
        memcpy(auStack_568,local_4e8,0x3c);
        ParallelFor<amrex::FillSignedDistance(amrex::MultiFab&,amrex::EB2::Level_const&,amrex::EBFArrayBoxFactory_const&,int,bool)::__2>
                  (box,in_stack_fffffffffffff810);
        in_stack_fffffffffffff7f0 = (FabArray<amrex::FArrayBox> *)local_264._28_8_;
        memcpy(auStack_6c0,local_270,0x3c);
        local_680 = local_1e0;
        ParallelFor<amrex::FillSignedDistance(amrex::MultiFab&,amrex::EB2::Level_const&,amrex::EBFArrayBoxFactory_const&,int,bool)::__3>
                  (box,(anon_class_152_8_6ab5d93c *)in_stack_fffffffffffff810);
        Gpu::streamSynchronize();
        PODVector<amrex::GpuArray<double,_6U>,_std::allocator<amrex::GpuArray<double,_6U>_>_>::
        ~PODVector((PODVector<amrex::GpuArray<double,_6U>,_std::allocator<amrex::GpuArray<double,_6U>_>_>
                    *)CONCAT62(in_stack_fffffffffffff7d2,uVar8));
      }
      PODVector<int,_std::allocator<int>_>::~PODVector
                ((PODVector<int,_std::allocator<int>_> *)CONCAT62(in_stack_fffffffffffff7d2,uVar8));
      PODVector<int,_std::allocator<int>_>::~PODVector
                ((PODVector<int,_std::allocator<int>_> *)CONCAT62(in_stack_fffffffffffff7d2,uVar8));
    }
    else {
      in_stack_fffffffffffff7e8 = (FabArray<amrex::FArrayBox> *)local_264._28_8_;
      memcpy(local_760,local_270,0x3c);
      ParallelFor<amrex::FillSignedDistance(amrex::MultiFab&,amrex::EB2::Level_const&,amrex::EBFArrayBoxFactory_const&,int,bool)::__4>
                (box,(anon_class_80_3_65adc863 *)in_stack_fffffffffffff810);
    }
    MFIter::operator++((MFIter *)(local_264 + 0x24));
  }
  MFIter::~MFIter((MFIter *)CONCAT62(in_stack_fffffffffffff7d2,uVar8));
  EB2::Level::Geom(local_150);
  Geometry::periodicity(in_stack_fffffffffffff800);
  FabArray<amrex::FArrayBox>::FillBoundary<double>
            (in_stack_fffffffffffff7f0,(int)((ulong)in_stack_fffffffffffff7e8 >> 0x20),
             (int)in_stack_fffffffffffff7e8,local_148,(bool)in_stack_fffffffffffff7df);
  return;
}

Assistant:

void FillSignedDistance (MultiFab& mf, EB2::Level const& ls_lev,
                         EBFArrayBoxFactory const& eb_factory, int refratio,
                         bool fluid_has_positive_sign)
{
    AMREX_ALWAYS_ASSERT(mf.is_nodal());

    ls_lev.fillLevelSet(mf, ls_lev.Geom()); // This is the implicit function, not the SDF.

    const auto& bndrycent = eb_factory.getBndryCent();
    const auto& areafrac = eb_factory.getAreaFrac();
    const auto& flags = eb_factory.getMultiEBCellFlagFab();
    const int eb_pad = bndrycent.nGrow();

    const auto dx_ls = ls_lev.Geom().CellSizeArray();
    const auto dx_eb = eb_factory.Geom().CellSizeArray();
    Real dx_eb_max = amrex::max(AMREX_D_DECL(dx_eb[0],dx_eb[1],dx_eb[2]));
    Real ls_roof = amrex::min(AMREX_D_DECL(dx_eb[0],dx_eb[1],dx_eb[2])) * (flags.nGrow()+1);

    Real fluid_sign = fluid_has_positive_sign ? 1._rt : -1._rt;

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(mf); mfi.isValid(); ++mfi)
    {
        Box const& gbx = mfi.fabbox();
        Array4<Real> const& fab = mf.array(mfi);

        if (bndrycent.ok(mfi))
        {
            const auto& flag = flags.const_array(mfi);

            Box eb_search = mfi.validbox();
            eb_search.coarsen(refratio).enclosedCells().grow(eb_pad);

            const int nallcells = eb_search.numPts();

            Gpu::DeviceVector<int> is_cut(nallcells);
            int* p_is_cut = is_cut.data();

            Gpu::DeviceVector<int> cutcell_offset(nallcells);
            int* p_cutcell_offset = cutcell_offset.data();

            int ncutcells = Scan::PrefixSum<int>
                (nallcells,
                 [=] AMREX_GPU_DEVICE (int icell) -> int
                 {
                     GpuArray<int,3> ijk = eb_search.atOffset3d(icell);
                     int is_cut_cell = flag(ijk[0],ijk[1],ijk[2]).isSingleValued();
                     p_is_cut[icell] = is_cut_cell;
                     return is_cut_cell;
                 },
                 [=] AMREX_GPU_DEVICE (int icell, int const& x)
                 {
                     p_cutcell_offset[icell] = x;
                 },
                 Scan::Type::exclusive, Scan::retSum);

            if (ncutcells > 0) {
                Gpu::DeviceVector<GpuArray<Real,AMREX_SPACEDIM*2> > facets(ncutcells);
                auto p_facets = facets.data();
                Array4<Real const> const& bcent = bndrycent.const_array(mfi);
                AMREX_D_TERM(Array4<Real const> const& apx = areafrac[0]->const_array(mfi);,
                             Array4<Real const> const& apy = areafrac[1]->const_array(mfi);,
                             Array4<Real const> const& apz = areafrac[2]->const_array(mfi));
                amrex::ParallelFor(eb_search, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                {
                    int icell = eb_search.index(IntVect(AMREX_D_DECL(i,j,k)));
                    if (p_is_cut[icell]) {
                        GpuArray<Real,AMREX_SPACEDIM*2>& fac = p_facets[p_cutcell_offset[icell]];
                        AMREX_D_TERM(fac[0] = (bcent(i,j,k,0)+Real(i)+0.5_rt) * dx_eb[0];,
                                     fac[1] = (bcent(i,j,k,1)+Real(j)+0.5_rt) * dx_eb[1];,
                                     fac[2] = (bcent(i,j,k,2)+Real(k)+0.5_rt) * dx_eb[2]);

                         Real axm = apx(i,  j  , k  );
                         Real axp = apx(i+1,j  , k  );
                         Real aym = apy(i,  j  , k  );
                         Real ayp = apy(i,  j+1, k  );
#if (AMREX_SPACEDIM == 3)
                         Real azm = apz(i,  j  , k  );
                         Real azp = apz(i,  j  , k+1);
                         Real apnorm = std::sqrt((axm-axp)*(axm-axp) +
                                                 (aym-ayp)*(aym-ayp) +
                                                 (azm-azp)*(azm-azp));
#else
                         Real apnorm = std::sqrt((axm-axp)*(axm-axp) +
                                                 (aym-ayp)*(aym-ayp));
#endif
                         Real apnorminv = 1._rt / apnorm;
                         AMREX_D_TERM(Real anrmx = (axp-axm) * apnorminv;,   // pointing to the wall
                                      Real anrmy = (ayp-aym) * apnorminv;,
                                      Real anrmz = (azp-azm) * apnorminv);

                         // pointing to the fluid
                         AMREX_D_TERM(fac[AMREX_SPACEDIM+0] = -anrmx;,
                                      fac[AMREX_SPACEDIM+1] = -anrmy;,
                                      fac[AMREX_SPACEDIM+2] = -anrmz);
                    }
                });

                amrex::ParallelFor(gbx, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                {
                    AMREX_D_TERM(Real dxinv = 1._rt/dx_eb[0];,
                                 Real dyinv = 1._rt/dx_eb[1];,
                                 Real dzinv = 1._rt/dx_eb[2]);
                    AMREX_D_TERM(Real x = i*dx_ls[0];,
                                 Real y = j*dx_ls[1];,
                                 Real z = k*dx_ls[2]);
                    Real min_dist2 = std::numeric_limits<Real>::max();
                    int i_nearest = 0;
                    for (int ifac  = 0; ifac < ncutcells; ++ifac) {
                        AMREX_D_TERM(Real cx = p_facets[ifac][0];,
                                     Real cy = p_facets[ifac][1];,
                                     Real cz = p_facets[ifac][2]);
                        Real dist2 = AMREX_D_TERM((x-cx)*(x-cx),+(y-cy)*(y-cy),+(z-cz)*(z-cz));
                        if (dist2 < min_dist2) {
                            i_nearest = ifac;
                            min_dist2 = dist2;
                        }
                    }

                    // Test if pos "projects onto" the nearest EB facet's interior
                    AMREX_D_TERM(Real cx = p_facets[i_nearest][0];,
                                 Real cy = p_facets[i_nearest][1];,
                                 Real cz = p_facets[i_nearest][2]);
                    AMREX_D_TERM(Real nx = p_facets[i_nearest][AMREX_SPACEDIM+0];,
                                 Real ny = p_facets[i_nearest][AMREX_SPACEDIM+1];,
                                 Real nz = p_facets[i_nearest][AMREX_SPACEDIM+2]);
                    Real dist_proj = AMREX_D_TERM((x-cx)*(-nx),+(y-cy)*(-ny),+(z-cz)*(-nz));
                    AMREX_D_TERM(Real eb_min_x = x + nx*dist_proj;,
                                 Real eb_min_y = y + ny*dist_proj;,
                                 Real eb_min_z = z + nz*dist_proj);
                    AMREX_D_TERM(int vi_cx = static_cast<int>(amrex::Math::floor(cx * dxinv));,
                                 int vi_cy = static_cast<int>(amrex::Math::floor(cy * dyinv));,
                                 int vi_cz = static_cast<int>(amrex::Math::floor(cz * dzinv)));
                    AMREX_D_TERM(int vi_x = static_cast<int>(amrex::Math::floor(eb_min_x * dxinv));,
                                 int vi_y = static_cast<int>(amrex::Math::floor(eb_min_y * dyinv));,
                                 int vi_z = static_cast<int>(amrex::Math::floor(eb_min_z * dzinv)));

                    bool min_pt_valid = false;
                    if ((AMREX_D_TERM(vi_cx == vi_x, && vi_cy == vi_y, && vi_cz == vi_z))  ||
                        amrex::Math::abs(dist_proj) > ls_roof + dx_eb_max)
                    {
                        // If the distance is very big, we can set it to true as well.
                        // Later the signed distance will be assigned the roof value.
                        min_pt_valid = true;
                    } else { // rounding error might give false negatives
#if (AMREX_SPACEDIM == 3)
                        for (int k_shift = -1; k_shift <= 1; ++k_shift) {
#endif
                        for (int j_shift = -1; j_shift <= 1; ++j_shift) {
                        for (int i_shift = -1; i_shift <= 1; ++i_shift) {
                            AMREX_D_TERM(vi_x = static_cast<int>(amrex::Math::floor((eb_min_x+i_shift*1.e-6_rt*dx_eb[0])*dxinv));,
                                         vi_y = static_cast<int>(amrex::Math::floor((eb_min_y+j_shift*1.e-6_rt*dx_eb[1])*dyinv));,
                                         vi_z = static_cast<int>(amrex::Math::floor((eb_min_z+k_shift*1.e-6_rt*dx_eb[2])*dzinv)));
                            if (AMREX_D_TERM(vi_cx == vi_x, && vi_cy == vi_y, && vi_cz == vi_z)) {
                                min_pt_valid = true;
                                goto after_loops;
                            }
                        }}
#if (AMREX_SPACEDIM == 3)
                        }
#endif
                        after_loops:;
                    }

                    // If projects onto nearest EB facet, then return projected distance
                    // Alternatively: find the nearest point on the EB edge
                    Real min_dist;
                    if ( min_pt_valid ) {
                        // this is a signed distance function
                        min_dist = dist_proj;
                    } else {
                        // fallback: find the nearest point on the EB edge
                        // revert the value of vi_x, vi_y and vi_z
                        AMREX_D_TERM(vi_x = static_cast<int>(amrex::Math::floor(eb_min_x * dxinv));,
                                     vi_y = static_cast<int>(amrex::Math::floor(eb_min_y * dyinv));,
                                     vi_z = static_cast<int>(amrex::Math::floor(eb_min_z * dzinv)));
                        auto c_vec = detail::facets_nearest_pt
                            ({AMREX_D_DECL(vi_x,vi_y,vi_z)}, {AMREX_D_DECL(vi_cx, vi_cy, vi_cz)},
                             {AMREX_D_DECL(x,y,z)}, {AMREX_D_DECL(nx,ny,nz)},
                             {AMREX_D_DECL(cx,cy,cz)}, dx_eb);
                        Real min_edge_dist2 = AMREX_D_TERM( (c_vec[0]-x)*(c_vec[0]-x),
                                                           +(c_vec[1]-y)*(c_vec[1]-y),
                                                           +(c_vec[2]-z)*(c_vec[2]-z));
                        min_dist = -std::sqrt(amrex::min(min_dist2, min_edge_dist2));
                    }

                    Real usd = amrex::min(ls_roof,amrex::Math::abs(min_dist));
                    if (fab(i,j,k) <= 0._rt) {
                        fab(i,j,k) = fluid_sign * usd;
                    } else {
                        fab(i,j,k) = (-fluid_sign) * usd;
                    }
                });
                Gpu::streamSynchronize();
            }
        } else {
            amrex::ParallelFor(gbx, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
            {
                if (fab(i,j,k) <= 0._rt) {
                    fab(i,j,k) = fluid_sign * ls_roof;
                } else {
                    fab(i,j,k) = (-fluid_sign) * ls_roof;
                }
            });
        }
    }

    mf.FillBoundary(0,1,ls_lev.Geom().periodicity());
}

}